

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

bool __thiscall Assembler::checkIfJump(Assembler *this,string *line)

{
  bool bVar1;
  bool bVar2;
  undefined8 *puVar3;
  string operand;
  string instruction;
  smatch jump;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  jump.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jump._M_begin._M_current = (char *)0x0;
  jump.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  jump.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,&jump,&jumpInstructionsReg_abi_cxx11_,0);
  if (!bVar1) goto LAB_00109d42;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&instruction,&jump,1);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&operand,&jump,2);
  std::__cxx11::string::string((string *)&local_78,(string *)&instruction);
  std::__cxx11::string::string((string *)&local_98,(string *)&operand);
  bVar2 = checkIfJumpRegDir(this,&local_78,&local_98);
  if (bVar2) {
LAB_00109d16:
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_d8,(string *)&operand);
    bVar2 = checkIfJumpAbsolute(this,&local_b8,&local_d8);
    if (bVar2) {
LAB_00109cfc:
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      goto LAB_00109d16;
    }
    std::__cxx11::string::string((string *)&local_f8,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_118,(string *)&operand);
    bVar2 = checkIfJumpMemDir(this,&local_f8,&local_118);
    if (bVar2) {
LAB_00109ce2:
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      goto LAB_00109cfc;
    }
    std::__cxx11::string::string((string *)&local_138,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_158,(string *)&operand);
    bVar2 = checkIfJumpPcRel(this,&local_138,&local_158);
    if (bVar2) {
LAB_00109cc8:
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      goto LAB_00109ce2;
    }
    std::__cxx11::string::string((string *)&local_178,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_198,(string *)&operand);
    bVar2 = checkIfJumpRegInd(this,&local_178,&local_198);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      goto LAB_00109cc8;
    }
    std::__cxx11::string::string((string *)&local_38,(string *)&instruction);
    std::__cxx11::string::string((string *)&local_58,(string *)&operand);
    bVar2 = checkIfJumpRegIndDis(this,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    if (!bVar2) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_0012bac8;
      __cxa_throw(puVar3,&AddressingError::typeinfo,std::exception::~exception);
    }
  }
  std::__cxx11::string::~string((string *)&operand);
  std::__cxx11::string::~string((string *)&instruction);
LAB_00109d42:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&jump);
  return bVar1;
}

Assistant:

bool Assembler::checkIfJump(string line) {
    smatch jump;
    if (regex_match(line, jump, jumpInstructionsReg)) {
        string instruction = jump.str(1);
        string operand = jump.str(2);
        if (checkIfJumpRegDir(instruction, operand) || checkIfJumpAbsolute(instruction, operand) ||
            checkIfJumpMemDir(instruction, operand) ||
            checkIfJumpPcRel(instruction, operand)
            || checkIfJumpRegInd(instruction, operand) ||
            checkIfJumpRegIndDis(instruction, operand))
            return true;
        else throw AddressingError();
    }
    return false;
}